

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectivePool(Parser *parser,int flags)

{
  CommandSequence *this;
  tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_> tVar1;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_30;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_28;
  
  this = (CommandSequence *)operator_new(0x30);
  CommandSequence::CommandSequence(this);
  tVar1.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       operator_new(0x68);
  CDirectiveAlignFill::CDirectiveAlignFill
            ((CDirectiveAlignFill *)
             tVar1.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl,4,AlignVirtual);
  local_28._M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
  .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       tVar1.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
       super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
  ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
            ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
              *)&this->commands,
             (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_28);
  if ((_Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
      local_28._M_t.
      super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
      super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl != (CAssemblerCommand *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                          .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl + 8))();
  }
  local_28._M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
  .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       (_Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)0x0;
  tVar1.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       operator_new(0x38);
  ArmPoolCommand::ArmPoolCommand
            ((ArmPoolCommand *)
             tVar1.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  local_30._M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
  .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       tVar1.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
       super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
  ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
            ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
              *)&this->commands,
             (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_30);
  if ((_Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
      super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl != (CAssemblerCommand *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                          .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl + 8))();
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectivePool(Parser& parser, int flags)
{
	auto seq = std::make_unique<CommandSequence>();
	seq->addCommand(std::make_unique<CDirectiveAlignFill>(4,CDirectiveAlignFill::AlignVirtual));
	seq->addCommand(std::make_unique<ArmPoolCommand>());

	return seq;
}